

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

broadphase_ptr __thiscall APhyBullet::BulletEngine::createDefaultBroadphase(BulletEngine *this)

{
  int iVar1;
  btDbvtBroadphase *this_00;
  btGhostPairCallback *ghostPairCallback;
  undefined4 extraout_var;
  BulletBroadphase *this_01;
  broadphase_ptr prVar2;
  
  this_00 = (btDbvtBroadphase *)operator_new(0x120);
  btDbvtBroadphase::btDbvtBroadphase(this_00,(btOverlappingPairCache *)0x0);
  ghostPairCallback = (btGhostPairCallback *)operator_new(8);
  (ghostPairCallback->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback =
       (_func_int **)&PTR__btOverlappingPairCallback_00222700;
  iVar1 = (*(this_00->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[9])(this_00);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x78))
            ((long *)CONCAT44(extraout_var,iVar1),ghostPairCallback);
  this_01 = (BulletBroadphase *)operator_new(0x20);
  BulletBroadphase::BulletBroadphase(this_01,(btBroadphaseInterface *)this_00,ghostPairCallback);
  prVar2 = (broadphase_ptr)operator_new(0x18);
  prVar2->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
  prVar2->object = (broadphase *)this_01;
  prVar2->strongCount = (__atomic_base<unsigned_int>)0x1;
  prVar2->weakCount = (__atomic_base<unsigned_int>)0x0;
  (this_01->super_broadphase).super_base_interface.myRefCounter = prVar2;
  return prVar2;
}

Assistant:

broadphase_ptr BulletEngine::createDefaultBroadphase()
{
    auto handle = new btDbvtBroadphase();
    auto ghostPairCallback = new btGhostPairCallback();
    handle->getOverlappingPairCache()->setInternalGhostPairCallback(ghostPairCallback);
    return makeObject<BulletBroadphase> (handle, ghostPairCallback).disown();
}